

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O3

void __thiscall ABlasterFX1::Effect(ABlasterFX1 *this)

{
  double dVar1;
  uint uVar2;
  PClassActor *type;
  FName local_2c;
  DVector3 local_28;
  
  uVar2 = FRandom::GenRand32(&pr_bfx1t);
  if ((uVar2 & 0xc0) == 0) {
    local_2c.Index = FName::NameManager::FindName(&FName::NameData,"BlasterSmoke",false);
    local_28.Z = (this->super_AFastProjectile).super_AActor.__Pos.Z + -8.0;
    dVar1 = (this->super_AFastProjectile).super_AActor.floorz;
    if (local_28.Z <= dVar1) {
      local_28.Z = dVar1;
    }
    local_28.X = (this->super_AFastProjectile).super_AActor.__Pos.X;
    local_28.Y = (this->super_AFastProjectile).super_AActor.__Pos.Y;
    type = ClassForSpawn(&local_2c);
    AActor::StaticSpawn(type,&local_28,ALLOW_REPLACE,false);
  }
  return;
}

Assistant:

void ABlasterFX1::Effect ()
{
	if (pr_bfx1t() < 64)
	{
		Spawn("BlasterSmoke", PosAtZ(MAX(Z() - 8., floorz)), ALLOW_REPLACE);
	}
}